

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t_backend.hpp
# Opt level: O0

string * __thiscall
boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>::
str_abi_cxx11_(string *__return_storage_ptr__,void *this,streamsize number_of_digits,
              fmtflags format_flags)

{
  size_t sVar1;
  _Ios_Fmtflags _Var2;
  char *pcVar3;
  allocator<char> local_5a;
  undefined1 local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  uint_fast8_t local_55;
  bool wr_string_is_ok;
  bool is_uppercase;
  bool show_pos;
  bool show_base;
  uint_fast8_t base_rep;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> pstr;
  fmtflags format_flags_local;
  streamsize number_of_digits_local;
  uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *this_local;
  
  pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = format_flags;
  sVar1 = ::math::wide_integer::
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
          wr_string_max_buffer_size_dec();
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,(ulong)sVar1,&local_41);
  std::allocator<char>::~allocator(&local_41);
  _Var2 = std::operator&(pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,_S_hex)
  ;
  local_55 = '\n';
  if (_Var2 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    local_55 = '\x10';
  }
  _Var2 = std::operator&(pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
                         _S_showbase);
  local_56 = _Var2 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
  _Var2 = std::operator&(pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
                         _S_showpos);
  local_57 = _Var2 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
  _Var2 = std::operator&(pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
                         _S_uppercase);
  local_58 = _Var2 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_40);
  local_59 = ::math::wide_integer::
             uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::wr_string<char*>
                       ((uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)this,
                        pcVar3,local_55,(bool)(local_56 & 1),(bool)(local_57 & 1),
                        (bool)(local_58 & 1),0,'0');
  if ((bool)local_59) {
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,&local_5a);
    std::allocator<char>::~allocator(&local_5a);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

WIDE_INTEGER_NODISCARD auto str(std::streamsize number_of_digits, const std::ios::fmtflags format_flags) const -> std::string
    {
      static_cast<void>(number_of_digits);

      // Use simple vector dynamic memory here. When using uintwide_t as a
      // Boost.Multiprecision number backend, we assume vector is available.

      std::vector<char>
        pstr
        (
          static_cast<typename std::vector<char>::size_type>(representation_type::wr_string_max_buffer_size_dec())
        );

      const auto base_rep     = static_cast<std::uint_fast8_t>(((format_flags & std::ios::hex) != 0) ? 16U : 10U);
      const auto show_base    = ((format_flags & std::ios::showbase)  != 0);
      const auto show_pos     = ((format_flags & std::ios::showpos)   != 0);
      const auto is_uppercase = ((format_flags & std::ios::uppercase) != 0);

      const auto wr_string_is_ok = m_value.wr_string(pstr.data(), base_rep, show_base, show_pos, is_uppercase);

      return (wr_string_is_ok ? std::string(pstr.data()) : std::string());
    }